

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embed.cpp
# Opt level: O0

int __thiscall ncnn::Embed::forward(Embed *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  Option *in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  long in_RDI;
  bool bVar1;
  Mat *unaff_retaddr;
  Mat *in_stack_00000008;
  int words;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int iVar2;
  Mat *in_stack_fffffffffffffff0;
  Mat *bias_data;
  
  bias_data = in_RSI;
  Mat::create(in_RSI,(int)((ulong)in_RDX >> 0x20),(int)in_RDX,(size_t)in_RCX,
              (Allocator *)CONCAT44((int)in_RSI->cstep * in_RSI->c,in_stack_ffffffffffffffb8));
  bVar1 = true;
  if (in_RDX->data != (void *)0x0) {
    bVar1 = in_RDX->cstep * (long)in_RDX->c == 0;
    in_stack_fffffffffffffff0 = in_RDX;
  }
  if (bVar1) {
    iVar2 = -100;
  }
  else {
    if (*(int *)(in_RDI + 0xe0) == 0) {
      embed(in_stack_00000008,unaff_retaddr,bias_data,in_stack_fffffffffffffff0,
            (int)((ulong)in_RDX >> 0x20),
            (Option *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    }
    else {
      embed_int8(in_RSI,(Mat *)(in_RDI + 0xe8),*(float *)(in_RDI + 0x178),(Mat *)(in_RDI + 0x130),
                 in_RDX,*(int *)(in_RDI + 0xd4),in_RCX);
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int Embed::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int words = static_cast<int>(bottom_blob.total());

    top_blob.create(num_output, words, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if NCNN_INT8
    if (int8_scale_term)
    {
        embed_int8(bottom_blob, weight_data, weight_data_int8_scale, bias_data, top_blob, input_dim, opt);
    }
    else
#endif // NCNN_INT8
    {
        embed(bottom_blob, weight_data, bias_data, top_blob, input_dim, opt);
    }

    return 0;
}